

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.h
# Opt level: O2

Point2D __thiscall
lazyTrees::LazyKdTree<Point2D>::nearest(LazyKdTree<Point2D> *this,Point2D *search)

{
  Point2D *pPVar1;
  double dVar2;
  double dVar3;
  Compare CVar4;
  double *pdVar5;
  LazyKdTree<Point2D> *pLVar6;
  Point2D *pPVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Point2D PVar12;
  Point2D best;
  Point2D otherBest;
  Point2D local_48;
  Point2D local_30;
  
  ensure_evaluated(this);
  pPVar7 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
           super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
           super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  if ((this->childPositive)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0 &&
      (this->childNegative)._M_t.
      super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
      .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl ==
      (LazyKdTree<Point2D> *)0x0) {
    uVar8 = *(undefined4 *)&pPVar7->x;
    uVar9 = *(undefined4 *)((long)&pPVar7->x + 4);
    uVar10 = *(undefined4 *)&pPVar7->y;
    uVar11 = *(undefined4 *)((long)&pPVar7->y + 4);
    goto LAB_0014553e;
  }
  CVar4 = dimension_compare(search,pPVar7,this->dim);
  local_48.x = 0.0;
  local_48.y = 0.0;
  if (CVar4 == NEGATIVE) {
    pLVar6 = (this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar6 != (LazyKdTree<Point2D> *)0x0) goto LAB_001453f0;
LAB_001453de:
    pPVar7 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
             super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
             super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
  }
  else {
    pLVar6 = (this->childPositive)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
    if (pLVar6 == (LazyKdTree<Point2D> *)0x0 || CVar4 != POSITIVE) goto LAB_001453de;
LAB_001453f0:
    PVar12 = nearest(pLVar6,search);
    pPVar7 = &local_48;
    local_48.x = PVar12.x;
    local_48.y = PVar12.y;
    dVar2 = square_dist(search,pPVar7);
    dVar3 = square_dist(search,(this->data)._M_t.
                               super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
                               super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                               super__Head_base<0UL,_Point2D_*,_false>._M_head_impl);
    uVar8 = SUB84(dVar2,0);
    uVar9 = (undefined4)((ulong)dVar2 >> 0x20);
    if (dVar3 < dVar2) {
      pPVar1 = (this->data)._M_t.super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>._M_t.
               super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
               super__Head_base<0UL,_Point2D_*,_false>._M_head_impl;
      local_48.x = pPVar1->x;
      local_48.y = pPVar1->y;
      uVar8 = SUB84(dVar3,0);
      uVar9 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    if ((double)CONCAT44(uVar9,uVar8) < 0.0) {
      dVar2 = sqrt((double)CONCAT44(uVar9,uVar8));
    }
    else {
      dVar2 = SQRT((double)CONCAT44(uVar9,uVar8));
    }
    pdVar5 = Point2D::operator[](search,this->dim);
    dVar3 = *pdVar5;
    pdVar5 = Point2D::operator[](search,this->dim);
    if (CVar4 == NEGATIVE) {
      if ((this->childPositive)._M_t.
          super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
          .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl !=
          (LazyKdTree<Point2D> *)0x0) {
        dVar3 = *pdVar5;
        pdVar5 = Point2D::operator[]((this->data)._M_t.
                                     super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>
                                     .super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim
                                    );
        if (*pdVar5 <= dVar2 + dVar3) {
          pLVar6 = (this->childPositive)._M_t.
                   super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                   .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
          goto LAB_001454f4;
        }
      }
    }
    else if ((this->childNegative)._M_t.
             super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
             .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl !=
             (LazyKdTree<Point2D> *)0x0) {
      pdVar5 = Point2D::operator[]((this->data)._M_t.
                                   super___uniq_ptr_impl<Point2D,_std::default_delete<Point2D>_>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_Point2D_*,_std::default_delete<Point2D>_>.
                                   super__Head_base<0UL,_Point2D_*,_false>._M_head_impl,this->dim);
      if (dVar3 - dVar2 <= *pdVar5) {
        pLVar6 = (this->childNegative)._M_t.
                 super___uniq_ptr_impl<lazyTrees::LazyKdTree<Point2D>,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_std::default_delete<lazyTrees::LazyKdTree<Point2D>_>_>
                 .super__Head_base<0UL,_lazyTrees::LazyKdTree<Point2D>_*,_false>._M_head_impl;
LAB_001454f4:
        PVar12 = nearest(pLVar6,search);
        local_30.x = PVar12.x;
        local_30.y = PVar12.y;
        dVar2 = square_dist(search,&local_30);
        pPVar7 = &local_48;
        dVar3 = square_dist(search,pPVar7);
        if (dVar2 < dVar3) {
          local_48.x = local_30.x;
          local_48.y = local_30.y;
        }
      }
    }
  }
  uVar8 = *(undefined4 *)&pPVar7->x;
  uVar9 = *(undefined4 *)((long)&pPVar7->x + 4);
  uVar10 = *(undefined4 *)&pPVar7->y;
  uVar11 = *(undefined4 *)((long)&pPVar7->y + 4);
LAB_0014553e:
  PVar12.x._4_4_ = uVar9;
  PVar12.x._0_4_ = uVar8;
  PVar12.y._4_4_ = uVar11;
  PVar12.y._0_4_ = uVar10;
  return PVar12;
}

Assistant:

P nearest(P const& search)
    {
        ensure_evaluated();

        if (is_leaf())
            return *data.get(); // reached the end, return current value

        const auto comp = dimension_compare(search, *data.get(), dim);

        P best; // nearest neighbor of search

        if (comp == NEGATIVE && childNegative)
            best = childNegative->nearest(search);
        else if (comp == POSITIVE && childPositive)
            best = childPositive->nearest(search);
        else
            return *data.get();

        double sqrDistanceBest = square_dist(search, best);
        const double sqrDistanceThis = square_dist(search, *data.get());

        if (sqrDistanceThis < sqrDistanceBest) {
            sqrDistanceBest = sqrDistanceThis;
            best = *data.get(); // make this value the best if it is closer than the
            // checked side
            // type
        }

        // check whether other side might have candidates as well
        const double distanceBest   = std::sqrt(sqrDistanceBest);
        const double borderNegative = search[dim] - distanceBest;
        const double borderPositive = search[dim] + distanceBest;

        // check whether distances to other side are smaller than currently best
        // and recurse into the "wrong" direction, to check for possibly additional
        // candidates
        if (comp == NEGATIVE && childPositive) {
            if (borderPositive >= (*data.get())[dim]) {
                const auto otherBest = childPositive->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        } else if (comp == POSITIVE && childNegative) {
            if (borderNegative <= (*data.get())[dim]) {
                const auto otherBest = childNegative->nearest(search);
                if (square_dist(search, otherBest) < square_dist(search, best))
                    best = otherBest;
            }
        }

        return best;
    }